

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.hpp
# Opt level: O3

AABox * __thiscall Sphere::boundingVolume(AABox *__return_storage_ptr__,Sphere *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = (this->center).x;
  fVar2 = (this->center).y;
  fVar3 = (this->center).z;
  fVar4 = this->radius;
  __return_storage_ptr__->x1 = fVar1 - fVar4;
  __return_storage_ptr__->x2 = fVar1 + fVar4;
  __return_storage_ptr__->y1 = fVar2 - fVar4;
  __return_storage_ptr__->y2 = fVar4 + fVar2;
  __return_storage_ptr__->z1 = fVar3 - fVar4;
  __return_storage_ptr__->z2 = fVar3 + fVar4;
  return __return_storage_ptr__;
}

Assistant:

AABox boundingVolume() const
	{
		AABox v;
		v.x1 = center.x - radius;
		v.x2 = center.x + radius;
		v.y1 = center.y - radius;
		v.y2 = center.y + radius;
		v.z1 = center.z - radius;
		v.z2 = center.z + radius;
		return v;
	}